

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_object_manager.cpp
# Opt level: O2

sc_event * __thiscall sc_core::sc_object_manager::find_event(sc_object_manager *this,char *name)

{
  iterator iVar1;
  sc_event *psVar2;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>_>
          ::find(&(this->m_instance_table)._M_t,&local_38);
  std::__cxx11::string::_M_dispose();
  if (((_Rb_tree_header *)iVar1._M_node ==
       &(this->m_instance_table)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar1._M_node[2]._M_parent != 2)) {
    psVar2 = (sc_event *)0x0;
  }
  else {
    psVar2 = *(sc_event **)(iVar1._M_node + 2);
  }
  return psVar2;
}

Assistant:

sc_event*
sc_object_manager::find_event(const char* name)
{
    instance_table_t::iterator it;
    it = m_instance_table.find(name);
    if(it != m_instance_table.end()
       && it->second.m_name_origin == SC_NAME_EVENT)
    {
        return static_cast<sc_event*>(it->second.m_element_p);
    } else {
        return NULL;
    }
}